

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

void fracture_rock(obj *obj)

{
  boolean bVar1;
  uint uVar2;
  
  if (((obj->otyp == 0x214) && (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) &&
     (flags.mon_moving == '\0')) {
    sokoban_trickster();
  }
  obj->otyp = 0x213;
  uVar2 = mt_random();
  obj->quan = uVar2 % 0x3c + 7;
  uVar2 = weight(obj);
  obj->owt = uVar2;
  obj->oclass = '\r';
  obj->onamelth = '\0';
  obj->oxlth = 0;
  *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xff9fffef;
  if (obj->where == '\x01') {
    obj_extract_self(obj);
    place_object(obj,level,(int)obj->ox,(int)obj->oy);
    bVar1 = does_block(obj->olev,(int)obj->ox,(int)obj->oy,(monst *)0x0);
    if (bVar1 == '\0') {
      unblock_point((int)obj->ox,(int)obj->oy);
    }
    if ((viz_array[obj->oy][obj->ox] & 2U) != 0) {
      newsym((int)obj->ox,(int)obj->oy);
      return;
    }
  }
  return;
}

Assistant:

void fracture_rock(struct obj *obj)
{
	/* A little Sokoban guilt... */
	if (obj->otyp == BOULDER && In_sokoban(&u.uz) && !flags.mon_moving)
	    sokoban_trickster();

	obj->otyp = ROCK;
	obj->quan = (long) rn1(60, 7);
	obj->owt = weight(obj);
	obj->oclass = GEM_CLASS;
	obj->known = FALSE;
	obj->onamelth = 0;		/* no names */
	obj->oxlth = 0;			/* no extra data */
	obj->oattached = OATTACHED_NOTHING;
	if (obj->where == OBJ_FLOOR) {
		obj_extract_self(obj);		/* move rocks back on top */
		place_object(obj, level, obj->ox, obj->oy);
		if (!does_block(obj->olev, obj->ox, obj->oy, NULL))
			unblock_point(obj->ox, obj->oy);
		if (cansee(obj->ox,obj->oy))
		    newsym(obj->ox,obj->oy);
	}
}